

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

int ppcemb_tlb_search(CPUPPCState_conflict2 *env,target_ulong address,uint32_t pid)

{
  int iVar1;
  hwaddr in_RAX;
  ulong uVar2;
  int iVar3;
  int in_R9D;
  ulong uVar4;
  hwaddr raddr;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)env->nb_tlb;
  if (env->nb_tlb < 1) {
    uVar2 = uVar4;
  }
  iVar3 = -1;
  raddr = in_RAX;
  do {
    if (uVar2 * 0x28 - uVar4 == 0) {
      return -1;
    }
    iVar1 = ppcemb_tlb_check((CPUPPCState_conflict2 *)((long)&((env->tlb).tlb6)->pte0 + uVar4),
                             (ppcemb_tlb_t_conflict2 *)&raddr,(hwaddr *)address,(ulong)pid,0,in_R9D,
                             (int)raddr);
    iVar3 = iVar3 + 1;
    uVar4 = uVar4 + 0x28;
  } while (iVar1 != 0);
  return iVar3;
}

Assistant:

static int ppcemb_tlb_search(CPUPPCState *env, target_ulong address,
                             uint32_t pid)
{
    ppcemb_tlb_t *tlb;
    hwaddr raddr;
    int i, ret;

    /* Default return value is no match */
    ret = -1;
    for (i = 0; i < env->nb_tlb; i++) {
        tlb = &env->tlb.tlbe[i];
        if (ppcemb_tlb_check(env, tlb, &raddr, address, pid, 0, i) == 0) {
            ret = i;
            break;
        }
    }

    return ret;
}